

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::I_formatter<spdlog::details::scoped_padder>::format
          (I_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  byte bVar3;
  buffer<char> *buf;
  uint uVar4;
  ulong uVar5;
  string_view fmt;
  format_args args;
  scoped_padder p;
  scoped_padder local_50;
  uint local_28 [4];
  
  scoped_padder::scoped_padder(&local_50,2,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_hour;
  uVar4 = uVar1 - 0xc;
  if ((int)uVar1 < 0xd) {
    uVar4 = uVar1;
  }
  if (uVar4 < 100) {
    sVar2 = (dest->super_buffer<char>).size_;
    uVar5 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar5 = sVar2 + 1;
    }
    bVar3 = (byte)((uVar4 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar3 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar5 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar5 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar4 + bVar3 * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_28;
    args.desc_ = 1;
    local_28[0] = uVar4;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_50);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(to12h(tm_time), dest);
    }